

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethswitch.cpp
# Opt level: O3

char * PrintFpgaList(uint16_t fpgaList)

{
  size_t i;
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  undefined2 in_register_0000003a;
  
  uVar1 = 0;
  pcVar2 = PrintFpgaList::buffer;
  do {
    if ((CONCAT22(in_register_0000003a,fpgaList) >> ((uint)uVar1 & 0x1f) & 1) != 0) {
      pcVar3 = PrintFpgaList::buffer;
      if (pcVar2 != PrintFpgaList::buffer) {
        *pcVar2 = ' ';
        pcVar3 = pcVar2 + 1;
      }
      if (uVar1 < 10) {
        *pcVar3 = (char)uVar1 + '0';
        pcVar2 = pcVar3 + 1;
      }
      else {
        *pcVar3 = '1';
        pcVar3[1] = (char)uVar1 + '&';
        pcVar2 = pcVar3 + 2;
      }
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x10);
  *pcVar2 = '\0';
  return PrintFpgaList::buffer;
}

Assistant:

const char *PrintFpgaList(uint16_t fpgaList)
{
    static char buffer[128];
    char *p = buffer;
    for (size_t i = 0; i < 16; i++) {
        if (fpgaList & (1<<i)) {
            if (p != buffer)
                *p++ = ' ';
            if (i < 10) {
                *p++ = '0'+i;
            }
            else {
                *p++ = '1';
                *p++ = '0'+(i-10);
            }
        }
    }
    *p = 0;
    return buffer;
}